

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O2

void chrono::utils::WriteCamera
               (string *filename,ChVector<double> *cam_location,ChVector<double> *cam_target,
               ChVector<double> *camera_upvec,string *delim)

{
  CSV_writer *pCVar1;
  CSV_writer csv;
  allocator local_1e1;
  string local_1e0;
  CSV_writer local_1c0;
  
  CSV_writer::CSV_writer(&local_1c0,delim);
  pCVar1 = operator<<(&local_1c0,cam_location);
  std::endl<char,std::char_traits<char>>((ostream *)&pCVar1->m_ss);
  pCVar1 = operator<<(&local_1c0,cam_target);
  std::endl<char,std::char_traits<char>>((ostream *)&pCVar1->m_ss);
  pCVar1 = operator<<(&local_1c0,camera_upvec);
  std::endl<char,std::char_traits<char>>((ostream *)&pCVar1->m_ss);
  std::__cxx11::string::string((string *)&local_1e0,"",&local_1e1);
  CSV_writer::write_to_file(&local_1c0,filename,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  CSV_writer::~CSV_writer(&local_1c0);
  return;
}

Assistant:

void WriteCamera(const std::string& filename,
                 const ChVector<>& cam_location,
                 const ChVector<>& cam_target,
                 const ChVector<>& camera_upvec,
                 const std::string& delim) {
    CSV_writer csv(delim);
    csv << cam_location << std::endl;
    csv << cam_target << std::endl;
    csv << camera_upvec << std::endl;
    csv.write_to_file(filename);
}